

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall
TypeOpFloatInt2Float::TypeOpFloatInt2Float
          (TypeOpFloatInt2Float *this,TypeFactory *t,Translate *trans)

{
  OpBehaviorFloatInt2Float *this_00;
  allocator local_41;
  string local_40 [32];
  Translate *local_20;
  Translate *trans_local;
  TypeFactory *t_local;
  TypeOpFloatInt2Float *this_local;
  
  local_20 = trans;
  trans_local = (Translate *)t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"INT2FLOAT",&local_41);
  TypeOpFunc::TypeOpFunc
            (&this->super_TypeOpFunc,t,CPUI_FLOAT_INT2FLOAT,(string *)local_40,TYPE_FLOAT,TYPE_INT);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084ce60;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x48000;
  this_00 = (OpBehaviorFloatInt2Float *)operator_new(0x18);
  OpBehaviorFloatInt2Float::OpBehaviorFloatInt2Float(this_00,local_20);
  (this->super_TypeOpFunc).super_TypeOp.behave = (OpBehavior *)this_00;
  return;
}

Assistant:

TypeOpFloatInt2Float::TypeOpFloatInt2Float(TypeFactory *t,const Translate *trans)
  : TypeOpFunc(t,CPUI_FLOAT_INT2FLOAT,"INT2FLOAT",TYPE_FLOAT,TYPE_INT)
{
  opflags = PcodeOp::unary | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatInt2Float(trans);
}